

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosTime.cpp
# Opt level: O2

void anon_unknown.dwarf_505b72::KokkosTime::kokkostime_register(Caliper *c,Channel *chn)

{
  Annotation *this;
  Events *pEVar1;
  ostream *poVar2;
  string sStack_278;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  Log local_218;
  
  this = (Annotation *)operator_new(0x10);
  cali::Annotation::Annotation(this,"region",0);
  cali::Annotation::Annotation(this + 1,"kernel_type",0x40);
  pEVar1 = cali::Channel::events(chn);
  local_238._8_8_ = 0;
  local_220 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:80:45)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:80:45)>
              ::_M_manager;
  local_238._M_unused._M_object = this;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar1->post_init_evt).mCb,(value_type *)&local_238);
  std::_Function_base::~_Function_base((_Function_base *)&local_238);
  pEVar1 = cali::Channel::events(chn);
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:107:42)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/services/kokkos/KokkosTime.cpp:107:42)>
              ::_M_manager;
  local_258._M_unused._M_object = this;
  std::
  vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
  ::push_back(&(pEVar1->finish_evt).mCb,(value_type *)&local_258);
  std::_Function_base::~_Function_base((_Function_base *)&local_258);
  std::ofstream::ofstream(&local_218);
  local_218.m_level = 1;
  poVar2 = cali::Log::stream(&local_218);
  cali::Channel::name_abi_cxx11_(&sStack_278,chn);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_278);
  poVar2 = std::operator<<(poVar2,": Registered kokkostime service");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&sStack_278);
  std::ofstream::~ofstream(&local_218);
  return;
}

Assistant:

static void kokkostime_register(Caliper* c, Channel* chn)
    {

        auto* instance = new KokkosTime(c, chn);
        chn->events().post_init_evt.connect([instance](Caliper* c, Channel* chn) {
            kokkosp_callbacks.kokkosp_begin_parallel_for_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) { instance->pushRegion(name, "kokkos.parallel_for"); }
            );
            kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) {
                    instance->pushRegion(name, "kokkos.parallel_reduce");
                }
            );
            kokkosp_callbacks.kokkosp_begin_parallel_scan_callback.connect(
                [&](const char* name, const uint32_t, uint64_t*) { instance->pushRegion(name, "kokkos.parallel_scan"); }
            );
            kokkosp_callbacks.kokkosp_begin_fence_callback.connect([&](const char* name, const uint32_t, uint64_t*) {
                instance->pushRegion(name, "kokkos.fence");
            });
            kokkosp_callbacks.kokkosp_end_parallel_for_callback.connect([&](const uint64_t) { instance->popRegion(); });
            kokkosp_callbacks.kokkosp_end_parallel_reduce_callback.connect([&](const uint64_t) {
                instance->popRegion();
            });
            kokkosp_callbacks.kokkosp_end_parallel_scan_callback.connect([&](const uint64_t) { instance->popRegion(); }
            );
            kokkosp_callbacks.kokkosp_end_fence_callback.connect([&](const uint64_t) { instance->popRegion(); });
            kokkosp_callbacks.kokkosp_push_region_callback.connect([&](const char* regionName) {
                instance->pushRegion(regionName, "kokkos.user_region");
            });
            kokkosp_callbacks.kokkosp_pop_region_callback.connect([&]() { instance->popRegion(); });
        });
        chn->events().finish_evt.connect([instance](Caliper*, Channel*) { delete instance; });

        Log(1).stream() << chn->name() << ": Registered kokkostime service" << std::endl;
    }